

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O2

void __thiscall Float_InfNanAreNotSupported_Test::TestBody(Float_InfNanAreNotSupported_Test *this)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"Inf",&local_29);
  anon_unknown.dwarf_af5d7::test_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"-Inf",&local_29);
  anon_unknown.dwarf_af5d7::test_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"inf",&local_29);
  anon_unknown.dwarf_af5d7::test_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"-inf",&local_29);
  anon_unknown.dwarf_af5d7::test_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"INF",&local_29);
  anon_unknown.dwarf_af5d7::test_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"-INF",&local_29);
  anon_unknown.dwarf_af5d7::test_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"NAN",&local_29);
  anon_unknown.dwarf_af5d7::test_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"NaN",&local_29);
  anon_unknown.dwarf_af5d7::test_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"Nan",&local_29);
  anon_unknown.dwarf_af5d7::test_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"nan",&local_29);
  anon_unknown.dwarf_af5d7::test_error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(Float, InfNanAreNotSupported) {
    test_error("Inf");
    test_error("-Inf");
    test_error("inf");
    test_error("-inf");
    test_error("INF");
    test_error("-INF");
    test_error("NAN");
    test_error("NaN");
    test_error("Nan");
    test_error("nan");
}